

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall SignerAttribute::SetDataSize(SignerAttribute *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = GetEncodedSize<Attribute>(&this->claimedAttributes);
  sVar2 = DerBase::EncodedSize(&(this->certifiedAttributes).super_DerBase);
  (this->super_DerBase).cbData = sVar2 + sVar1;
  return sVar2 + sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = GetEncodedSize(claimedAttributes) + certifiedAttributes.EncodedSize();
		return cbData;
	}